

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::ToPropertyDescriptor
               (Var propertySpec,PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  RecyclableObject *pRVar4;
  
  bVar1 = VarIs<Js::JavascriptProxy>(propertySpec);
  if (bVar1) {
LAB_00acb022:
    iVar2 = ToPropertyDescriptorForProxyObjects(propertySpec,descriptor,scriptContext);
  }
  else {
    bVar1 = VarIs<Js::RecyclableObject>(propertySpec);
    if (bVar1) {
      pRVar4 = VarTo<Js::RecyclableObject>(propertySpec);
      pRVar4 = RecyclableObject::GetPrototype(pRVar4);
      bVar1 = CheckIfPrototypeChainContainsProxyObject(pRVar4);
      if (bVar1) goto LAB_00acb022;
    }
    iVar2 = ToPropertyDescriptorForGenericObjects(propertySpec,descriptor,scriptContext);
  }
  if (iVar2 == 0) {
    BVar3 = 0;
  }
  else {
    if ((descriptor->getterSpecified != false) || (descriptor->setterSpecified == true)) {
      if (descriptor->valueSpecified == true) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec43,(PCWSTR)0x0);
      }
      if (descriptor->writableSpecified == true) {
        bVar1 = PropertyDescriptor::IsWritable(descriptor);
        JavascriptError::ThrowTypeError(scriptContext,bVar1 ^ 0x800a13ad,L"writable");
      }
    }
    Memory::Recycler::WBSetBit((char *)&descriptor->originalVar);
    (descriptor->originalVar).ptr = propertySpec;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&descriptor->originalVar);
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL JavascriptOperators::ToPropertyDescriptor(Var propertySpec, PropertyDescriptor* descriptor, ScriptContext* scriptContext)
    {
        if (VarIs<JavascriptProxy>(propertySpec) || (
            VarIs<RecyclableObject>(propertySpec) &&
            JavascriptOperators::CheckIfPrototypeChainContainsProxyObject(VarTo<RecyclableObject>(propertySpec)->GetPrototype())))
        {
            if (ToPropertyDescriptorForProxyObjects(propertySpec, descriptor, scriptContext) == FALSE)
            {
                return FALSE;
            }
        }
        else
        {
            if (ToPropertyDescriptorForGenericObjects(propertySpec, descriptor, scriptContext) == FALSE)
            {
                return FALSE;
            }
        }

        if (descriptor->GetterSpecified() || descriptor->SetterSpecified())
        {
            if (descriptor->ValueSpecified())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotHaveAccessorsAndValue);
            }
            if (descriptor->WritableSpecified())
            {
                int32 hCode = descriptor->IsWritable() ? JSERR_InvalidAttributeTrue : JSERR_InvalidAttributeFalse;
                JavascriptError::ThrowTypeError(scriptContext, hCode, _u("writable"));
            }
        }

        descriptor->SetOriginal(propertySpec);

        return TRUE;
    }